

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::BSTerase(treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           *this,iterator *position)

{
  Colour CVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  treeNode<ft::pair<const_int,_int>_> *ptVar4;
  treeNode<ft::pair<const_int,_int>_> **pptVar5;
  treeNode<ft::pair<const_int,_int>_> *ptVar6;
  treeNode<ft::pair<const_int,_int>_> *x;
  Colour CVar7;
  bool bVar8;
  
  ptVar2 = (this->m_tree).NIL;
  ((this->m_tree).m_first)->parent->left = ptVar2;
  ((this->m_tree).m_last)->parent->right = ptVar2;
  ptVar3 = position->m_node;
  CVar7 = ptVar3->colour;
  ptVar6 = ptVar3->left;
  x = ptVar3->right;
  if (ptVar6 != ptVar2) {
    if (x == ptVar2) {
      if ((this->m_tree).m_root == ptVar3) {
        pptVar5 = &(this->m_tree).m_root;
LAB_0010bc91:
        *pptVar5 = ptVar6;
      }
      else {
        ptVar2 = ptVar3->parent;
        if (ptVar2->left == ptVar3) {
          pptVar5 = &ptVar2->left;
          goto LAB_0010bc91;
        }
        if (ptVar2->right == ptVar3) {
          pptVar5 = &ptVar2->right;
          goto LAB_0010bc91;
        }
      }
      ptVar6->parent = ptVar3->parent;
      x = ptVar6;
      goto LAB_0010bc9f;
    }
    ptVar2 = position->m_tree->NIL;
    ptVar6 = ptVar3;
    if (x == ptVar2) {
      do {
        ptVar4 = ptVar6->parent;
        bVar8 = ptVar4->right == ptVar6;
        ptVar6 = ptVar4;
      } while (bVar8);
    }
    else {
      do {
        ptVar4 = x;
        x = ptVar4->left;
      } while (ptVar4->left != ptVar2);
    }
    CVar1 = ptVar4->colour;
    x = ptVar4->right;
    ptVar2 = ptVar4->parent;
    ptVar6 = x;
    if (ptVar2 != ptVar3) {
      if ((this->m_tree).m_root == ptVar4) {
        pptVar5 = &(this->m_tree).m_root;
LAB_0010bc34:
        *pptVar5 = x;
      }
      else {
        if (ptVar2->left == ptVar4) {
          pptVar5 = &ptVar2->left;
          goto LAB_0010bc34;
        }
        if (ptVar2->right == ptVar4) {
          pptVar5 = &ptVar2->right;
          goto LAB_0010bc34;
        }
      }
      x->parent = ptVar2;
      ptVar6 = ptVar3->right;
      ptVar4->right = ptVar6;
    }
    ptVar6->parent = ptVar4;
    if ((this->m_tree).m_root == ptVar3) {
      pptVar5 = &(this->m_tree).m_root;
LAB_0010bc6d:
      *pptVar5 = ptVar4;
    }
    else {
      ptVar2 = ptVar3->parent;
      if (ptVar2->left == ptVar3) {
        pptVar5 = &ptVar2->left;
        goto LAB_0010bc6d;
      }
      if (ptVar2->right == ptVar3) {
        pptVar5 = &ptVar2->right;
        goto LAB_0010bc6d;
      }
    }
    ptVar4->parent = ptVar3->parent;
    ptVar2 = ptVar3->left;
    ptVar4->left = ptVar2;
    ptVar2->parent = ptVar4;
    ptVar4->colour = CVar7;
    CVar7 = CVar1;
    goto LAB_0010bc9f;
  }
  if ((this->m_tree).m_root == ptVar3) {
    pptVar5 = &(this->m_tree).m_root;
LAB_0010bc1d:
    *pptVar5 = x;
  }
  else {
    ptVar2 = ptVar3->parent;
    if (ptVar2->left == ptVar3) {
      pptVar5 = &ptVar2->left;
      goto LAB_0010bc1d;
    }
    if (ptVar2->right == ptVar3) {
      pptVar5 = &ptVar2->right;
      goto LAB_0010bc1d;
    }
  }
  x->parent = ptVar3->parent;
LAB_0010bc9f:
  operator_delete(ptVar3);
  if (CVar7 == BLACK) {
    fixEraseViolation(this,x);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}